

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::BitfieldExtractCaseInstance::compare
          (BitfieldExtractCaseInstance *this,void **inputs,void **outputs)

{
  DataType dataType;
  uint uVar1;
  ostream *poVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  Hex<8UL> hex;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  dataType = (((this->super_IntegerFunctionTestInstance).m_spec.inputs.
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type;
  uVar1 = glu::getDataTypeScalarSize(dataType);
  bVar3 = (byte)*inputs[2];
  uVar4 = ~(-1 << (bVar3 & 0x1f));
  if (*inputs[2] == 0x20) {
    uVar4 = 0xffffffff;
  }
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  uVar8 = 0;
  do {
    if (uVar6 == uVar8) {
LAB_0078a762:
      return (long)(int)uVar1 <= (long)uVar8;
    }
    uVar7 = 0;
    if (*inputs[1] != 0x20) {
      uVar7 = *(uint *)((long)*inputs + uVar8 * 4) >> ((byte)*inputs[1] & 0x1f) & uVar4;
    }
    uVar5 = uVar7 & 1 << (bVar3 - 1 & 0x1f);
    if (uVar5 != 0) {
      uVar5 = ~uVar4;
    }
    if (3 < dataType - TYPE_INT) {
      uVar5 = 0;
    }
    if (*(uint *)((long)*outputs + uVar8 * 4) != (uVar5 | uVar7)) {
      poVar2 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar8);
      poVar2 = std::operator<<(poVar2,"] = ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar5 | uVar7;
      tcu::Format::operator<<(poVar2,hex);
      goto LAB_0078a762;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				offset			= *((const int*)inputs[1]);
		const int				bits			= *((const int*)inputs[2]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	valMask	= (bits == 32 ? ~0u : ((1u<<bits)-1u));
			const deUint32	baseVal	= (offset == 32) ? (0) : ((value >> offset) & valMask);
			const deUint32	ref		= baseVal | ((isSigned && (baseVal & (1<<(bits-1)))) ? ~valMask : 0u);

			if (out != ref)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}